

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::FillFreeMemory
          (LargeHeapBlock *this,Recycler *recycler,void *address,size_t size)

{
  PageHeapData *pPVar1;
  IdleDecommitPageAllocator *pIVar2;
  int __c;
  
  __c = 0xca;
  if (recycler->verifyEnabled == false) {
    __c = 0xfe;
  }
  pPVar1 = this->pageHeapData;
  if (((pPVar1 != (PageHeapData *)0x0) && (pPVar1->pageHeapMode != PageHeapModeOff)) &&
     (pPVar1->isLockedWithPageHeap == true)) {
    PageHeapUnLockPages(this);
  }
  memset(address,__c,size);
  if ((this->pageHeapData != (PageHeapData *)0x0) &&
     (this->pageHeapData->pageHeapMode != PageHeapModeOff)) {
    pIVar2 = HeapBlock::GetPageAllocator(&this->super_HeapBlock,this->heapInfo);
    if ((pIVar2->super_PageAllocator).disablePageReuse == true) {
      PageHeapLockPages(this);
      return;
    }
  }
  return;
}

Assistant:

void LargeHeapBlock::FillFreeMemory(Recycler * recycler, __in_bcount(size) void * address, size_t size)
{
    // For now, we don't do anything in release build because we don't reuse this memory until we return
    // the pages to the allocator which will zero out the whole page
    byte memFill = 0;
    bool doMemFill = false;

#ifdef RECYCLER_FREE_MEM_FILL
    memFill = DbgMemFill;
    doMemFill = true;
#endif

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        memFill = Recycler::VerifyMemFill;
        doMemFill = true;
    }
#endif

#if defined(RECYCLER_FREE_MEM_FILL) || defined(RECYCLER_MEMORY_VERIFY)
    if (doMemFill)
    {
        if (this->InPageHeapMode() && pageHeapData->isLockedWithPageHeap) 
        {
            PageHeapUnLockPages();
        }
        memset(address, memFill, size);
    }
#endif

#if defined(RECYCLER_NO_PAGE_REUSE)
    if (this->InPageHeapMode() && this->GetPageAllocator(this->heapInfo)->IsPageReuseDisabled())
    {
        this->PageHeapLockPages();
    }
#endif
}